

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O0

void __thiscall
ninx::parser::exception::ParserException::ParserException
          (ParserException *this,int line,string *origin,string *message)

{
  string local_48;
  string *local_28;
  string *message_local;
  string *origin_local;
  ParserException *pPStack_10;
  int line_local;
  ParserException *this_local;
  
  local_28 = message;
  message_local = origin;
  origin_local._4_4_ = line;
  pPStack_10 = this;
  make_message(&local_48,line,origin,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__ParserException_001c6d50;
  this->line = origin_local._4_4_;
  this->origin = message_local;
  return;
}

Assistant:

ninx::parser::exception::ParserException::ParserException(int line, std::string &origin, const std::string &message)
        : runtime_error(
        make_message(line, origin, message)), line{line}, origin(origin) {

}